

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::Clara::Opt::Opt(Opt *this,bool *ref)

{
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  shared_ptr<Catch::Clara::Detail::BoundRef> local_28;
  
  std::make_shared<Catch::Clara::Detail::BoundFlagRef,bool&>((bool *)&local_38);
  local_28.super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  local_28.super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Stack_30._M_pi;
  local_38 = (element_type *)0x0;
  _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            (&this->super_ParserRefImpl<Catch::Clara::Opt>,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.
              super___shared_ptr<Catch::Clara::Detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  (this->super_ParserRefImpl<Catch::Clara::Opt>).super_ComposableParserImpl<Catch::Clara::Opt>.
  super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Opt_001a4460;
  (this->m_optNames).super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_optNames).super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_optNames).super__Vector_base<Catch::StringRef,_std::allocator<Catch::StringRef>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Opt::Opt(bool& ref) :
            ParserRefImpl(std::make_shared<Detail::BoundFlagRef>(ref)) {}